

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

void glu::sl::dumpValue(TestLog *log,Value *val,char *storageName,int arrayNdx)

{
  bool bVar1;
  DataType dataType_00;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  char *pcVar5;
  const_reference pvVar6;
  MessageBuilder *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  MessageBuilder local_368;
  float local_1e8;
  int local_1e4;
  float v;
  int elemNdx_1;
  int colNdx;
  int rowNdx;
  int numCols;
  int numRows;
  Element *e;
  int local_1c0;
  int elemNdx;
  int scalarNdx;
  ostringstream local_1b0 [8];
  ostringstream result;
  int scalarSize;
  DataType dataType;
  char *valueName;
  int arrayNdx_local;
  char *storageName_local;
  Value *val_local;
  TestLog *log_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  dataType_00 = VarType::getBasicType(&val->type);
  iVar2 = getDataTypeScalarSize(dataType_00);
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  poVar4 = std::operator<<((ostream *)local_1b0,"    ");
  poVar4 = std::operator<<(poVar4,storageName);
  std::operator<<(poVar4," ");
  pcVar5 = getDataTypeName(dataType_00);
  poVar4 = std::operator<<((ostream *)local_1b0,pcVar5);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,pcVar3);
  std::operator<<(poVar4,":");
  bVar1 = isDataTypeScalar(dataType_00);
  if (bVar1) {
    std::operator<<((ostream *)local_1b0," ");
  }
  bVar1 = isDataTypeVector(dataType_00);
  if (bVar1) {
    std::operator<<((ostream *)local_1b0," [ ");
  }
  else {
    bVar1 = isDataTypeMatrix(dataType_00);
    if (bVar1) {
      std::operator<<((ostream *)local_1b0,"\n");
    }
  }
  bVar1 = isDataTypeScalarOrVector(dataType_00);
  if (bVar1) {
    for (local_1c0 = 0; local_1c0 < iVar2; local_1c0 = local_1c0 + 1) {
      e._4_4_ = arrayNdx;
      _numCols = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&val->elements,(long)(arrayNdx * iVar2 + local_1c0));
      pcVar3 = "";
      if (local_1c0 != 0) {
        pcVar3 = ", ";
      }
      std::operator<<((ostream *)local_1b0,pcVar3);
      bVar1 = isDataTypeFloatOrVec(dataType_00);
      if (bVar1) {
        std::ostream::operator<<(local_1b0,_numCols->float32);
      }
      else {
        bVar1 = isDataTypeIntOrIVec(dataType_00);
        if (bVar1) {
          std::ostream::operator<<(local_1b0,_numCols->int32);
        }
        else {
          bVar1 = isDataTypeUintOrUVec(dataType_00);
          if (bVar1) {
            std::ostream::operator<<(local_1b0,_numCols->int32);
          }
          else {
            bVar1 = isDataTypeBoolOrBVec(dataType_00);
            if (bVar1) {
              pcVar3 = "false";
              if ((float)_numCols->int32 != 0.0) {
                pcVar3 = "true";
              }
              std::operator<<((ostream *)local_1b0,pcVar3);
            }
          }
        }
      }
    }
  }
  else {
    bVar1 = isDataTypeMatrix(dataType_00);
    if (bVar1) {
      rowNdx = getDataTypeMatrixNumRows(dataType_00);
      colNdx = getDataTypeMatrixNumColumns(dataType_00);
      for (elemNdx_1 = 0; elemNdx_1 < rowNdx; elemNdx_1 = elemNdx_1 + 1) {
        std::operator<<((ostream *)local_1b0,"       [ ");
        for (v = 0.0; (int)v < colNdx; v = (float)((int)v + 1)) {
          local_1e4 = arrayNdx;
          pvVar6 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                   operator[](&val->elements,(long)(arrayNdx * iVar2 + elemNdx_1 * colNdx + (int)v))
          ;
          local_1e8 = pvVar6->float32;
          pcVar3 = ", ";
          if (v == 0.0) {
            pcVar3 = "";
          }
          poVar4 = std::operator<<((ostream *)local_1b0,pcVar3);
          std::ostream::operator<<(poVar4,local_1e8);
        }
        std::operator<<((ostream *)local_1b0," ]\n");
      }
    }
  }
  bVar1 = isDataTypeScalar(dataType_00);
  if (bVar1) {
    std::operator<<((ostream *)local_1b0,"\n");
  }
  else {
    bVar1 = isDataTypeVector(dataType_00);
    if (bVar1) {
      std::operator<<((ostream *)local_1b0," ]\n");
    }
  }
  tcu::TestLog::operator<<(&local_368,log,(BeginMessageToken *)&tcu::TestLog::Message);
  std::__cxx11::ostringstream::str();
  this = tcu::MessageBuilder::operator<<(&local_368,&local_388);
  tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_388);
  tcu::MessageBuilder::~MessageBuilder(&local_368);
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return;
}

Assistant:

static void dumpValue (tcu::TestLog& log, const Value& val, const char* storageName, int arrayNdx)
{
	const char* const	valueName		= val.name.c_str();
	const DataType		dataType		= val.type.getBasicType();
	int					scalarSize		= getDataTypeScalarSize(dataType);
	ostringstream		result;

	result << "    " << storageName << " ";

	result << getDataTypeName(dataType) << " " << valueName << ":";

	if (isDataTypeScalar(dataType))
		result << " ";
	if (isDataTypeVector(dataType))
		result << " [ ";
	else if (isDataTypeMatrix(dataType))
		result << "\n";

	if (isDataTypeScalarOrVector(dataType))
	{
		for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
		{
			int						elemNdx	= arrayNdx;
			const Value::Element&	e		= val.elements[elemNdx*scalarSize + scalarNdx];
			result << ((scalarNdx != 0) ? ", " : "");

			if (isDataTypeFloatOrVec(dataType))
				result << e.float32;
			else if (isDataTypeIntOrIVec(dataType))
				result << e.int32;
			else if (isDataTypeUintOrUVec(dataType))
				result << (deUint32)e.int32;
			else if (isDataTypeBoolOrBVec(dataType))
				result << (e.bool32 ? "true" : "false");
		}
	}
	else if (isDataTypeMatrix(dataType))
	{
		int numRows = getDataTypeMatrixNumRows(dataType);
		int numCols = getDataTypeMatrixNumColumns(dataType);
		for (int rowNdx = 0; rowNdx < numRows; rowNdx++)
		{
			result << "       [ ";
			for (int colNdx = 0; colNdx < numCols; colNdx++)
			{
				int		elemNdx = arrayNdx;
				float	v		= val.elements[elemNdx*scalarSize + rowNdx*numCols + colNdx].float32;
				result << ((colNdx==0) ? "" : ", ") << v;
			}
			result << " ]\n";
		}
	}

	if (isDataTypeScalar(dataType))
		result << "\n";
	else if (isDataTypeVector(dataType))
		result << " ]\n";

	log << TestLog::Message << result.str() << TestLog::EndMessage;
}